

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<int,_kj::Own<kj::(anonymous_namespace)::RefcountedInt>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:476:40),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<int,_kj::Own<kj::(anonymous_namespace)::RefcountedInt>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:476:40),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> depResult;
  ExceptionOr<int> local_5a0;
  ExceptionOr<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> local_438;
  Exception local_2c8;
  Exception local_168;
  
  local_438.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_438.value.ptr.disposer = (Disposer *)0x0;
  local_438.value.ptr.ptr = (RefcountedInt *)0x0;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&local_438.super_ExceptionOrValue);
  if (local_438.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::Exception(&local_2c8,&local_438.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_168.ownFile.content.ptr = local_2c8.ownFile.content.ptr;
    local_168.ownFile.content.size_ = local_2c8.ownFile.content.size_;
    local_168.ownFile.content.disposer = local_2c8.ownFile.content.disposer;
    local_2c8.ownFile.content.ptr = (char *)0x0;
    local_2c8.ownFile.content.size_ = 0;
    local_168.file = local_2c8.file;
    local_168.line = local_2c8.line;
    local_168.type = local_2c8.type;
    local_168.description.content.ptr = local_2c8.description.content.ptr;
    local_168.description.content.size_ = local_2c8.description.content.size_;
    local_2c8.description.content.ptr = (char *)0x0;
    local_2c8.description.content.size_ = 0;
    local_168.description.content.disposer = local_2c8.description.content.disposer;
    local_168.context.ptr.disposer = local_2c8.context.ptr.disposer;
    local_168.context.ptr.ptr = local_2c8.context.ptr.ptr;
    local_2c8.context.ptr.ptr = (Context *)0x0;
    memcpy(local_168.trace,local_2c8.trace,0x104);
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_5a0,&local_168);
    local_5a0.value.ptr.isSet = false;
    Exception::~Exception(&local_168);
    ExceptionOr<int>::operator=((ExceptionOr<int> *)output,&local_5a0);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_5a0);
    Exception::~Exception(&local_2c8);
  }
  else if (local_438.value.ptr.ptr != (RefcountedInt *)0x0) {
    anon_class_1_0_00000001_for_func::operator()
              ((anon_class_1_0_00000001_for_func *)this,&local_438.value.ptr);
    local_5a0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_5a0.value.ptr.isSet = true;
    local_5a0.value.ptr.field_1.value = 0x1c8;
    ExceptionOr<int>::operator=((ExceptionOr<int> *)output,&local_5a0);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_5a0);
  }
  ExceptionOr<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>::~ExceptionOr(&local_438);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }